

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O2

void __thiscall OpenMD::AngleR::process(AngleR *this)

{
  int *piVar1;
  char cVar2;
  pointer pdVar3;
  pointer piVar4;
  int iVar5;
  int iVar6;
  pointer pdVar7;
  pointer piVar8;
  StuntDouble *pSVar9;
  StuntDouble *pSVar10;
  uint whichFrame;
  double dVar11;
  int ii;
  int jj;
  Vector3d vec;
  Vector3d CenterOfMass;
  Thermo thermo;
  Vector3d r2;
  Vector3d r1_1;
  Vector3d r1;
  Vector3d pos;
  DumpReader reader;
  int local_13d4;
  SelectionManager *local_13d0;
  double local_13c8;
  uint local_13bc;
  SelectionManager *local_13b8;
  int local_13b0;
  int local_13ac;
  Vector<double,_3U> local_13a8;
  Vector<double,_3U> local_1390;
  SelectionEvaluator *local_1378;
  SelectionEvaluator *local_1370;
  Thermo local_1368;
  RotMat3x3d local_1360;
  RectMatrix<double,_3U,_3U> local_1318;
  Vector<double,_3U> local_12d0;
  Vector<double,_3U> local_12b8;
  Vector<double,_3U> local_12a0;
  DumpReader local_1288;
  
  local_1368.info_ = (this->super_StaticAnalyser).info_;
  cVar2 = ((local_1368.info_)->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.
          field_0x2b;
  DumpReader::DumpReader(&local_1288,local_1368.info_,&(this->super_StaticAnalyser).dumpFilename_);
  local_13b0 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = local_13b0 / (this->super_StaticAnalyser).step_;
  pdVar3 = (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar7 = (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar7 != pdVar3; pdVar7 = pdVar7 + 1) {
    *pdVar7 = 0.0;
  }
  pdVar3 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar7 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar7 != pdVar3; pdVar7 = pdVar7 + 1) {
    *pdVar7 = 0.0;
  }
  piVar4 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar8 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar8 != piVar4; piVar8 = piVar8 + 1) {
    *piVar8 = 0;
  }
  local_1370 = &this->evaluator1_;
  local_13d0 = &this->seleMan1_;
  local_1378 = &this->evaluator2_;
  local_13b8 = &this->seleMan2_;
  whichFrame = 0;
  while ((int)whichFrame < local_13b0) {
    local_13bc = whichFrame;
    DumpReader::readFrame(&local_1288,whichFrame);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    Thermo::getCom((Vector3d *)&local_1390,&local_1368);
    if ((this->evaluator1_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_1318,local_1370);
      SelectionManager::setSelectionSet(local_13d0,(SelectionSet *)&local_1318);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1318)
      ;
    }
    if (this->doVect_ == true) {
      pSVar9 = SelectionManager::beginSelected(local_13d0,&local_13d4);
      while (pSVar9 != (StuntDouble *)0x0) {
        StuntDouble::getPos((Vector3d *)&local_12a0,pSVar9);
        operator-((Vector<double,_3U> *)&local_1318,&local_1390,&local_12a0);
        Vector<double,_3U>::Vector(&local_12b8,(Vector<double,_3U> *)&local_1318);
        local_13c8 = Vector<double,_3U>::length(&local_12b8);
        if (pSVar9->objType_ - otDAtom < 2) {
          StuntDouble::getA(&local_1360,pSVar9);
          SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_1318,&local_1360);
          operator*(&local_12d0,&local_1318,(Vector<double,_3U> *)OpenMD::V3Z);
          Vector<double,_3U>::Vector(&local_13a8,&local_12d0);
          Vector<double,_3U>::normalize(&local_13a8);
          Vector<double,_3U>::normalize(&local_12b8);
          dVar11 = dot<double,3u>(&local_12b8,&local_13a8);
          if (local_13c8 < this->len_) {
            iVar5 = (int)(local_13c8 / this->deltaR_);
            pdVar7 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7[iVar5] = dVar11 + pdVar7[iVar5];
            piVar1 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar5;
            *piVar1 = *piVar1 + 1;
          }
        }
        pSVar9 = SelectionManager::nextSelected(local_13d0,&local_13d4);
      }
    }
    else if (this->doOffset_ == true) {
      pSVar9 = SelectionManager::beginSelected(local_13d0,&local_13d4);
      while (pSVar9 != (StuntDouble *)0x0) {
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_1318);
        if (this->doOffset2_ == true) {
          pSVar10 = SimInfo::getIOIndexToIntegrableObject
                              ((this->super_StaticAnalyser).info_,
                               this->seleOffset2_ + pSVar9->globalIndex_);
          StuntDouble::getPos((Vector3d *)&local_12a0,pSVar10);
          operator-((Vector<double,_3U> *)&local_1360,&local_1390,&local_12a0);
          Vector3<double>::operator=
                    ((Vector3<double> *)&local_1318,(Vector<double,_3U> *)&local_1360);
        }
        else {
          StuntDouble::getPos((Vector3d *)&local_12a0,pSVar9);
          operator-((Vector<double,_3U> *)&local_1360,&local_1390,&local_12a0);
          Vector3<double>::operator=
                    ((Vector3<double> *)&local_1318,(Vector<double,_3U> *)&local_1360);
        }
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1318);
        }
        pSVar9 = SimInfo::getIOIndexToIntegrableObject
                           ((this->super_StaticAnalyser).info_,
                            this->seleOffset_ + pSVar9->globalIndex_);
        StuntDouble::getPos((Vector3d *)&local_12b8,pSVar9);
        operator-(&local_12a0,&local_1390,&local_12b8);
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_1360,&local_12a0);
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1318);
        }
        OpenMD::operator+(&local_13a8,(Vector<double,_3U> *)&local_1318,
                          (Vector<double,_3U> *)&local_1360);
        operator*(&local_12b8,0.5,&local_13a8);
        Vector<double,_3U>::Vector(&local_12a0,&local_12b8);
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12a0);
        }
        local_13c8 = Vector<double,_3U>::length(&local_12a0);
        operator-(&local_13a8,(Vector<double,_3U> *)&local_1318,(Vector<double,_3U> *)&local_1360);
        Vector<double,_3U>::Vector(&local_12b8,&local_13a8);
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12b8);
        }
        Vector<double,_3U>::normalize(&local_12a0);
        Vector<double,_3U>::normalize(&local_12b8);
        dVar11 = dot<double,3u>(&local_12a0,&local_12b8);
        if (local_13c8 < this->len_) {
          iVar5 = (int)(local_13c8 / this->deltaR_);
          pdVar7 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7[iVar5] = dVar11 + pdVar7[iVar5];
          piVar1 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar5;
          *piVar1 = *piVar1 + 1;
        }
        pSVar9 = SelectionManager::nextSelected(local_13d0,&local_13d4);
      }
    }
    else {
      if ((this->evaluator2_).isDynamic_ == true) {
        SelectionEvaluator::evaluate((SelectionSet *)&local_1318,local_1378);
        SelectionManager::setSelectionSet(local_13b8,(SelectionSet *)&local_1318);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
                   &local_1318);
      }
      iVar5 = SelectionManager::getSelectionCount(local_13d0);
      iVar6 = SelectionManager::getSelectionCount(local_13b8);
      if (iVar5 != iVar6) {
        snprintf(painCave.errMsg,2000,
                 "In frame %d, the number of selected StuntDoubles are\n\tnot the same in --sele1 and sele2\n"
                 ,(ulong)local_13bc);
        painCave.isFatal = 0;
        painCave.severity = 3;
        simError();
      }
      pSVar9 = SelectionManager::beginSelected(local_13d0,&local_13d4);
      pSVar10 = SelectionManager::beginSelected(local_13b8,&local_13ac);
      while ((pSVar10 != (StuntDouble *)0x0 && (pSVar9 != (StuntDouble *)0x0))) {
        StuntDouble::getPos((Vector3d *)&local_12a0,pSVar9);
        operator-((Vector<double,_3U> *)&local_1360,&local_1390,&local_12a0);
        Vector<double,_3U>::Vector
                  ((Vector<double,_3U> *)&local_1318,(Vector<double,_3U> *)&local_1360);
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1318);
        }
        StuntDouble::getPos((Vector3d *)&local_12b8,pSVar10);
        operator-(&local_12a0,&local_1390,&local_12b8);
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_1360,&local_12a0);
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1318);
        }
        OpenMD::operator+(&local_13a8,(Vector<double,_3U> *)&local_1318,
                          (Vector<double,_3U> *)&local_1360);
        operator*(&local_12b8,0.5,&local_13a8);
        Vector<double,_3U>::Vector(&local_12a0,&local_12b8);
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12a0);
        }
        operator-(&local_13a8,(Vector<double,_3U> *)&local_1318,(Vector<double,_3U> *)&local_1360);
        Vector<double,_3U>::Vector(&local_12b8,&local_13a8);
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12b8);
        }
        local_13c8 = Vector<double,_3U>::length(&local_12a0);
        Vector<double,_3U>::normalize(&local_12a0);
        Vector<double,_3U>::normalize(&local_12b8);
        dVar11 = dot<double,3u>(&local_12a0,&local_12b8);
        if (local_13c8 < this->len_) {
          iVar5 = (int)(local_13c8 / this->deltaR_);
          pdVar7 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7[iVar5] = dVar11 + pdVar7[iVar5];
          piVar1 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar5;
          *piVar1 = *piVar1 + 1;
        }
        pSVar9 = SelectionManager::nextSelected(local_13d0,&local_13d4);
        pSVar10 = SelectionManager::nextSelected(local_13b8,&local_13ac);
      }
    }
    whichFrame = local_13bc + (this->super_StaticAnalyser).step_;
  }
  processHistogram(this);
  writeAngleR(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void AngleR::process() {
    StuntDouble* sd1;
    StuntDouble* sd2;
    int ii;
    int jj;
    RealType distance;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Thermo thermo(info_);
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    nProcessed_ = nFrames / step_;

    std::fill(avgAngleR_.begin(), avgAngleR_.end(), 0.0);
    std::fill(histogram_.begin(), histogram_.end(), 0.0);
    std::fill(count_.begin(), count_.end(), 0);

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Vector3d CenterOfMass = thermo.getCom();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (doVect_) {
        for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
             sd1 = seleMan1_.nextSelected(ii)) {
          Vector3d pos = sd1->getPos();

          Vector3d r1 = CenterOfMass - pos;
          distance    = r1.length();
          // only do this if the stunt double actually has a vector associated
          // with it
          if (sd1->isDirectional()) {
            Vector3d vec = sd1->getA().transpose() * V3Z;
            vec.normalize();
            r1.normalize();
            RealType cosangle = dot(r1, vec);

            if (distance < len_) {
              int whichBin = int(distance / deltaR_);
              histogram_[whichBin] += cosangle;
              count_[whichBin] += 1;
            }
          }
        }
      } else {
        if (doOffset_) {
          for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
               sd1 = seleMan1_.nextSelected(ii)) {
            // This will require careful rewriting if StaticProps is
            // ever parallelized.  For an example, see
            // Thermo::getTaggedAtomPairDistance
            Vector3d r1;

            if (doOffset2_) {
              int sd1Aind       = sd1->getGlobalIndex() + seleOffset2_;
              StuntDouble* sd1A = info_->getIOIndexToIntegrableObject(sd1Aind);
              r1                = CenterOfMass - sd1A->getPos();
            } else {
              r1 = CenterOfMass - sd1->getPos();
            }

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            int sd2Index = sd1->getGlobalIndex() + seleOffset_;
            sd2          = info_->getIOIndexToIntegrableObject(sd2Index);

            Vector3d r2 = CenterOfMass - sd2->getPos();
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            Vector3d rc = 0.5 * (r1 + r2);
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rc);

            distance = rc.length();

            Vector3d vec = r1 - r2;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            rc.normalize();
            vec.normalize();
            RealType cosangle = dot(rc, vec);
            if (distance < len_) {
              int whichBin = int(distance / deltaR_);
              histogram_[whichBin] += cosangle;
              count_[whichBin] += 1;
            }
          }
        } else {
          if (evaluator2_.isDynamic()) {
            seleMan2_.setSelectionSet(evaluator2_.evaluate());
          }

          if (seleMan1_.getSelectionCount() != seleMan2_.getSelectionCount()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "In frame %d, the number of selected StuntDoubles are\n"
                     "\tnot the same in --sele1 and sele2\n",
                     istep);
            painCave.severity = OPENMD_INFO;
            painCave.isFatal  = 0;
            simError();
          }

          for (sd1                             = seleMan1_.beginSelected(ii),
              sd2                              = seleMan2_.beginSelected(jj);
               sd1 != NULL && sd2 != NULL; sd1 = seleMan1_.nextSelected(ii),
              sd2                              = seleMan2_.nextSelected(jj)) {
            Vector3d r1 = CenterOfMass - sd1->getPos();
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            Vector3d r2 = CenterOfMass - sd2->getPos();
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            Vector3d rc = 0.5 * (r1 + r2);
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rc);

            Vector3d vec = r1 - r2;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            distance = rc.length();

            rc.normalize();
            vec.normalize();
            RealType cosangle = dot(rc, vec);
            if (distance < len_) {
              int whichBin = int(distance / deltaR_);
              histogram_[whichBin] += cosangle;
              count_[whichBin] += 1;
            }
          }
        }
      }
    }
    processHistogram();
    writeAngleR();
  }